

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O2

EStatusCode __thiscall CFFFileInput::ReadCharStrings(CFFFileInput *this)

{
  ushort uVar1;
  EStatusCode EVar2;
  CharStrings *pCVar3;
  LongFilePositionType inNewOffset;
  long lVar4;
  long lVar5;
  unsigned_long i;
  ulong uVar6;
  
  uVar1 = this->mFontsCount;
  pCVar3 = (CharStrings *)operator_new__((ulong)uVar1 << 4);
  if (uVar1 != 0) {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)&pCVar3->mCharStringsIndex + lVar5) = 0;
      (&pCVar3->mCharStringsType)[lVar5] = '\0';
      *(undefined2 *)((long)&pCVar3->mCharStringsCount + lVar5) = 0;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)uVar1 * 0x10 != lVar5);
  }
  this->mCharStrings = pCVar3;
  EVar2 = eSuccess;
  lVar5 = 8;
  for (uVar6 = 0; (EVar2 == eSuccess && (uVar6 < uVar1)); uVar6 = uVar6 + 1) {
    inNewOffset = GetCharStringsPosition(this,(unsigned_short)uVar6);
    lVar4 = GetCharStringType(this,(unsigned_short)uVar6);
    pCVar3 = this->mCharStrings;
    *(char *)((long)pCVar3 + lVar5 + -8) = (char)lVar4;
    if (inNewOffset == 0) {
      *(undefined2 *)((long)pCVar3 + lVar5 + -6) = 0;
      *(undefined8 *)(&pCVar3->mCharStringsType + lVar5) = 0;
      EVar2 = eSuccess;
    }
    else {
      CFFPrimitiveReader::SetOffset(&this->mPrimitivesReader,inNewOffset);
      EVar2 = ReadSubrsFromIndex(this,(unsigned_short *)((long)this->mCharStrings + lVar5 + -6),
                                 (CharStringsIndex *)(&this->mCharStrings->mCharStringsType + lVar5)
                                );
    }
    uVar1 = this->mFontsCount;
    lVar5 = lVar5 + 0x10;
  }
  if (EVar2 != eSuccess) {
    return EVar2;
  }
  EVar2 = CFFPrimitiveReader::GetInternalState(&this->mPrimitivesReader);
  return EVar2;
}

Assistant:

EStatusCode CFFFileInput::ReadCharStrings()
{
	// scan all charstrings of all included fonts
	mCharStrings = new CharStrings[mFontsCount];
	EStatusCode status = PDFHummus::eSuccess;

	for(unsigned long i=0; i < mFontsCount && (PDFHummus::eSuccess == status); ++i)
	{
		LongFilePositionType  charStringsPosition = GetCharStringsPosition(i);	
		mCharStrings[i].mCharStringsType = (Byte)GetCharStringType(i);
		if(0 == charStringsPosition)
		{
			mCharStrings[i].mCharStringsCount = 0;
			mCharStrings[i].mCharStringsIndex = NULL;
		}
		else
		{
			mPrimitivesReader.SetOffset(charStringsPosition);
			status = ReadSubrsFromIndex(mCharStrings[i].mCharStringsCount,
										&(mCharStrings[i].mCharStringsIndex));
		}
	}

	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();
}